

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_calledWithoutParameters_Test::testBody
          (TEST_MockParameterTest_calledWithoutParameters_Test *this)

{
  int iVar1;
  MockCheckedExpectedCall *this_00;
  UtestShell *test;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  SimpleString local_130;
  SimpleString local_120;
  SimpleString local_110;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  undefined1 local_c0 [8];
  MockExpectedParameterDidntHappenFailure expectedFailure;
  SimpleString local_48 [2];
  undefined1 local_28 [8];
  MockExpectedCallsListForTest expectations;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockParameterTest_calledWithoutParameters_Test *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  SimpleString::SimpleString(local_48,"foo");
  this_00 = MockExpectedCallsListForTest::addFunction
                      ((MockExpectedCallsListForTest *)local_28,local_48);
  SimpleString::SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,"p1");
  MockExpectedCall::withParameter
            (&this_00->super_MockExpectedCall,
             (SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,1);
  SimpleString::~SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  SimpleString::~SimpleString(local_48);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_d0,"foo");
  MockExpectedParameterDidntHappenFailure::MockExpectedParameterDidntHappenFailure
            ((MockExpectedParameterDidntHappenFailure *)local_c0,test,&local_d0,
             (MockExpectedCallsList *)local_28,(MockExpectedCallsList *)local_28);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::SimpleString(&local_e0,"");
  pMVar2 = mock(&local_e0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_f0,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_f0);
  SimpleString::SimpleString(&local_100,"p1");
  MockExpectedCall::withParameter((MockExpectedCall *)CONCAT44(extraout_var,iVar1),&local_100,1);
  SimpleString::~SimpleString(&local_100);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::SimpleString(&local_110,"");
  pMVar2 = mock(&local_110,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_120,"foo");
  (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_120);
  SimpleString::~SimpleString(&local_120);
  SimpleString::~SimpleString(&local_110);
  SimpleString::SimpleString(&local_130,"");
  pMVar2 = mock(&local_130,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_130);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x220);
  MockExpectedParameterDidntHappenFailure::~MockExpectedParameterDidntHappenFailure
            ((MockExpectedParameterDidntHappenFailure *)local_c0);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  return;
}

Assistant:

TEST(MockParameterTest, calledWithoutParameters)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("p1", 1);
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "foo", expectations, expectations);

    mock().expectOneCall("foo").withParameter("p1", 1);
    mock().actualCall("foo");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}